

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O1

void get_msurf_descriptor_precompute_gauss_case(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  int col;
  int row;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int scale;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar49 [64];
  undefined1 auVar53 [64];
  float fVar54;
  float ry;
  float rx;
  float gauss_s2;
  float local_b0;
  float local_ac;
  ulong local_a8;
  uint local_9c;
  long local_98;
  ulong local_90;
  interest_point *local_88;
  ulong local_80;
  float local_74;
  float local_70;
  uint local_6c;
  uint local_68;
  float local_64;
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar28._8_4_ = 0x80000000;
  auVar28._0_8_ = 0x8000000080000000;
  auVar28._12_4_ = 0x80000000;
  fVar45 = ipoint->scale;
  auVar47._8_4_ = 0x3effffff;
  auVar47._0_8_ = 0x3effffff3effffff;
  auVar47._12_4_ = 0x3effffff;
  local_58 = ZEXT416((uint)fVar45);
  auVar17 = vpternlogd_avx512vl(auVar47,local_58,auVar28,0xf8);
  auVar17 = ZEXT416((uint)(fVar45 + auVar17._0_4_));
  auVar17 = vroundss_avx(auVar17,auVar17,0xb);
  scale = (int)auVar17._0_4_;
  fVar54 = -0.08 / (fVar45 * fVar45);
  auVar17 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)ipoint->x),auVar28,0xf8);
  auVar17 = ZEXT416((uint)(ipoint->x + auVar17._0_4_));
  auVar17 = vroundss_avx(auVar17,auVar17,0xb);
  auVar18._0_8_ = (double)auVar17._0_4_;
  auVar18._8_8_ = auVar17._8_8_;
  auVar20._0_8_ = (double)fVar45;
  auVar20._8_8_ = 0;
  auVar17 = vfmadd231sd_fma(auVar18,auVar20,ZEXT816(0x3fe0000000000000));
  local_64 = (float)auVar17._0_8_;
  auVar17 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)ipoint->y),auVar28,0xf8);
  auVar17 = ZEXT416((uint)(ipoint->y + auVar17._0_4_));
  auVar17 = vroundss_avx(auVar17,auVar17,0xb);
  auVar19._0_8_ = (double)auVar17._0_4_;
  auVar19._8_8_ = auVar17._8_8_;
  auVar17 = vfmadd231sd_fma(auVar19,auVar20,ZEXT816(0x3fe0000000000000));
  local_70 = (float)auVar17._0_8_;
  auVar17 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 0.5)),auVar28,0xf8);
  auVar17 = ZEXT416((uint)(fVar45 * 0.5 + auVar17._0_4_));
  auVar17 = vroundss_avx(auVar17,auVar17,0xb);
  auVar18 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 1.5)),auVar28,0xf8);
  auVar18 = ZEXT416((uint)(fVar45 * 1.5 + auVar18._0_4_));
  auVar18 = vroundss_avx(auVar18,auVar18,0xb);
  auVar19 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 2.5)),auVar28,0xf8);
  auVar19 = ZEXT416((uint)(fVar45 * 2.5 + auVar19._0_4_));
  auVar19 = vroundss_avx(auVar19,auVar19,0xb);
  auVar20 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 3.5)),auVar28,0xf8);
  auVar20 = ZEXT416((uint)(fVar45 * 3.5 + auVar20._0_4_));
  auVar20 = vroundss_avx(auVar20,auVar20,0xb);
  auVar21 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 4.5)),auVar28,0xf8);
  auVar21 = ZEXT416((uint)(fVar45 * 4.5 + auVar21._0_4_));
  auVar21 = vroundss_avx(auVar21,auVar21,0xb);
  auVar22 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 5.5)),auVar28,0xf8);
  auVar22 = ZEXT416((uint)(auVar22._0_4_ + fVar45 * 5.5));
  auVar22 = vroundss_avx(auVar22,auVar22,0xb);
  auVar23 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 6.5)),auVar28,0xf8);
  auVar23 = ZEXT416((uint)(fVar45 * 6.5 + auVar23._0_4_));
  auVar23 = vroundss_avx(auVar23,auVar23,0xb);
  auVar53 = ZEXT1664(auVar23);
  auVar24 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 7.5)),auVar28,0xf8);
  auVar24 = ZEXT416((uint)(fVar45 * 7.5 + auVar24._0_4_));
  auVar24 = vroundss_avx(auVar24,auVar24,0xb);
  auVar25 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 8.5)),auVar28,0xf8);
  auVar25 = ZEXT416((uint)(fVar45 * 8.5 + auVar25._0_4_));
  auVar25 = vroundss_avx(auVar25,auVar25,0xb);
  auVar26 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 9.5)),auVar28,0xf8);
  auVar26 = ZEXT416((uint)(fVar45 * 9.5 + auVar26._0_4_));
  auVar26 = vroundss_avx(auVar26,auVar26,0xb);
  auVar27 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 10.5)),auVar28,0xf8);
  auVar27 = ZEXT416((uint)(fVar45 * 10.5 + auVar27._0_4_));
  auVar27 = vroundss_avx(auVar27,auVar27,0xb);
  auVar28 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)(fVar45 * 11.5)),auVar28,0xf8);
  auVar28 = ZEXT416((uint)(fVar45 * 11.5 + auVar28._0_4_));
  auVar28 = vroundss_avx(auVar28,auVar28,0xb);
  fVar37 = auVar19._0_4_;
  fVar45 = fVar37 + auVar18._0_4_;
  fVar30 = fVar37 + auVar17._0_4_;
  fVar31 = fVar37 - auVar17._0_4_;
  fVar32 = fVar37 - auVar18._0_4_;
  fVar33 = fVar37 - auVar20._0_4_;
  fVar34 = fVar37 - auVar21._0_4_;
  fVar35 = fVar37 - auVar22._0_4_;
  local_80 = CONCAT44(local_80._4_4_,fVar37 - auVar23._0_4_);
  fVar44 = auVar24._0_4_;
  fVar37 = fVar44 - auVar20._0_4_;
  fVar38 = fVar44 - auVar21._0_4_;
  fVar39 = fVar44 - auVar22._0_4_;
  fVar40 = fVar44 - auVar23._0_4_;
  local_90 = CONCAT44(local_90._4_4_,fVar44 - auVar25._0_4_);
  fVar42 = fVar44 - auVar26._0_4_;
  local_a8 = CONCAT44(local_a8._4_4_,fVar44 - auVar27._0_4_);
  fVar44 = fVar44 - auVar28._0_4_;
  local_88 = ipoint;
  fVar29 = expf(fVar54 * fVar45 * fVar45);
  fVar30 = expf(fVar30 * fVar30 * fVar54);
  fVar31 = expf(fVar31 * fVar31 * fVar54);
  fVar32 = expf(fVar32 * fVar32 * fVar54);
  fVar33 = expf(fVar33 * fVar33 * fVar54);
  fVar34 = expf(fVar34 * fVar34 * fVar54);
  fVar35 = expf(fVar35 * fVar35 * fVar54);
  fVar36 = expf((float)local_80 * (float)local_80 * fVar54);
  fVar37 = expf(fVar37 * fVar37 * fVar54);
  fVar38 = expf(fVar38 * fVar38 * fVar54);
  fVar39 = expf(fVar39 * fVar39 * fVar54);
  fVar40 = expf(fVar40 * fVar40 * fVar54);
  fVar41 = expf((float)local_90 * (float)local_90 * fVar54);
  fVar42 = expf(fVar42 * fVar42 * fVar54);
  fVar43 = expf((float)local_a8 * (float)local_a8 * fVar54);
  fVar44 = expf(fVar44 * fVar44 * fVar54);
  local_90 = (ulong)(uint)(scale * 2);
  fVar45 = 0.0;
  local_9c = 4;
  local_a8 = 0;
  local_98 = 0;
  uVar12 = 0;
  iVar15 = -8;
  do {
    local_98 = (long)(int)local_98;
    uVar9 = 0xfffffff8;
    local_6c = uVar12;
    do {
      iVar10 = (int)uVar9 + -4;
      auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar13 = 0xfffffffc;
      local_74 = fVar45;
      local_68 = uVar12;
      local_60 = uVar9;
      do {
        iVar7 = (int)local_60;
        uVar3 = (undefined4)uVar13;
        if (iVar7 < 2) {
          if (iVar7 == -8) {
            fVar45 = -1.0;
            switch(uVar3) {
            case 0:
switchD_00197800_caseD_0:
              fVar45 = 1.0;
              break;
            case 1:
switchD_00197860_caseD_1:
              fVar45 = fVar40;
              break;
            case 2:
switchD_00197860_caseD_2:
              fVar45 = fVar39;
              break;
            case 3:
switchD_00197860_caseD_3:
              fVar45 = fVar38;
              break;
            case 4:
switchD_00197860_caseD_4:
              fVar45 = fVar37;
              break;
            case 0xfffffffc:
switchD_00197860_caseD_fffffffc:
              fVar45 = fVar44;
              break;
            case 0xfffffffd:
switchD_00197860_caseD_fffffffd:
              fVar45 = fVar43;
              break;
            case 0xfffffffe:
switchD_00197860_caseD_fffffffe:
              fVar45 = fVar42;
              break;
            case 0xffffffff:
switchD_00197860_caseD_ffffffff:
              fVar45 = fVar41;
            }
          }
          else {
            fVar45 = -1.0;
            if (iVar7 == -3) {
              fVar45 = -1.0;
              switch(uVar3) {
              case 0:
                goto switchD_00197800_caseD_0;
              case 1:
                goto switchD_00197800_caseD_1;
              case 2:
                goto switchD_00197800_caseD_2;
              case 3:
                goto switchD_00197800_caseD_3;
              case 4:
                goto switchD_00197800_caseD_4;
              case 0xfffffffc:
                goto switchD_00197800_caseD_fffffffc;
              case 0xfffffffd:
                goto switchD_00197800_caseD_fffffffd;
              case 0xfffffffe:
                goto switchD_00197800_caseD_fffffffe;
              case 0xffffffff:
                goto switchD_00197800_caseD_ffffffff;
              }
            }
          }
        }
        else if (iVar7 == 2) {
          fVar45 = -1.0;
          switch(uVar3) {
          case 0:
            goto switchD_00197800_caseD_0;
          case 1:
switchD_00197800_caseD_ffffffff:
            fVar45 = fVar33;
            break;
          case 2:
switchD_00197800_caseD_fffffffe:
            fVar45 = fVar34;
            break;
          case 3:
switchD_00197800_caseD_fffffffd:
            fVar45 = fVar35;
            break;
          case 4:
switchD_00197800_caseD_fffffffc:
            fVar45 = fVar36;
            break;
          case 0xfffffffc:
switchD_00197800_caseD_4:
            fVar45 = fVar29;
            break;
          case 0xfffffffd:
switchD_00197800_caseD_3:
            fVar45 = fVar30;
            break;
          case 0xfffffffe:
switchD_00197800_caseD_2:
            fVar45 = fVar31;
            break;
          case 0xffffffff:
switchD_00197800_caseD_1:
            fVar45 = fVar32;
          }
        }
        else {
          fVar45 = -1.0;
          if (iVar7 == 7) {
            fVar45 = -1.0;
            switch(uVar3) {
            case 0:
              goto switchD_00197800_caseD_0;
            case 1:
              goto switchD_00197860_caseD_ffffffff;
            case 2:
              goto switchD_00197860_caseD_fffffffe;
            case 3:
              goto switchD_00197860_caseD_fffffffd;
            case 4:
              goto switchD_00197860_caseD_fffffffc;
            case 0xfffffffc:
              goto switchD_00197860_caseD_4;
            case 0xfffffffd:
              goto switchD_00197860_caseD_3;
            case 0xfffffffe:
              goto switchD_00197860_caseD_2;
            case 0xffffffff:
              goto switchD_00197860_caseD_1;
            }
          }
        }
        auVar17._0_4_ = (float)iVar10;
        auVar17._4_12_ = auVar53._4_12_;
        auVar17 = vfmadd132ss_fma(auVar17,ZEXT416((uint)local_70),ZEXT416((uint)local_58._0_4_));
        auVar22._8_4_ = 0x3effffff;
        auVar22._0_8_ = 0x3effffff3effffff;
        auVar22._12_4_ = 0x3effffff;
        auVar21._8_4_ = 0x80000000;
        auVar21._0_8_ = 0x8000000080000000;
        auVar21._12_4_ = 0x80000000;
        auVar18 = vpternlogd_avx512vl(auVar22,auVar17,auVar21,0xf8);
        auVar17 = ZEXT416((uint)(auVar17._0_4_ + auVar18._0_4_));
        auVar17 = vroundss_avx(auVar17,auVar17,0xb);
        row = (int)auVar17._0_4_ - scale;
        iVar7 = (int)local_90;
        iVar16 = -0xc;
        local_80 = uVar13;
        do {
          if (iVar15 < 2) {
            if (iVar15 == -8) {
              fVar54 = -1.0;
              switch(iVar16) {
              case -0xc:
switchD_00197a2e_caseD_fffffff4:
                fVar54 = fVar44;
                break;
              case -0xb:
switchD_00197a2e_caseD_fffffff5:
                fVar54 = fVar43;
                break;
              case -10:
switchD_00197a2e_caseD_fffffff6:
                fVar54 = fVar42;
                break;
              case -9:
switchD_00197a2e_caseD_fffffff7:
                fVar54 = fVar41;
                break;
              case -8:
switchD_001979ce_caseD_fffffff8:
                fVar54 = 1.0;
                break;
              case -7:
switchD_00197a2e_caseD_fffffff9:
                fVar54 = fVar40;
                break;
              case -6:
switchD_00197a2e_caseD_fffffffa:
                fVar54 = fVar39;
                break;
              case -5:
switchD_00197a2e_caseD_fffffffb:
                fVar54 = fVar38;
                break;
              case -4:
switchD_00197a2e_caseD_fffffffc:
                fVar54 = fVar37;
              }
            }
            else {
              fVar54 = -1.0;
              if (iVar15 == -3) {
                fVar54 = -1.0;
                switch(iVar16) {
                case -0xc:
                  goto switchD_001979ce_caseD_fffffff4;
                case -0xb:
                  goto switchD_001979ce_caseD_fffffff5;
                case -10:
                  goto switchD_001979ce_caseD_fffffff6;
                case -9:
                  goto switchD_001979ce_caseD_fffffff7;
                case -8:
                  goto switchD_001979ce_caseD_fffffff8;
                case -7:
                  goto switchD_001979ce_caseD_fffffff9;
                case -6:
                  goto switchD_001979ce_caseD_fffffffa;
                case -5:
                  goto switchD_001979ce_caseD_fffffffb;
                case -4:
                  goto switchD_001979ce_caseD_fffffffc;
                }
              }
            }
          }
          else if (iVar15 == 2) {
            fVar54 = -1.0;
            switch(iVar16) {
            case -0xc:
switchD_001979ce_caseD_fffffffc:
              fVar54 = fVar29;
              break;
            case -0xb:
switchD_001979ce_caseD_fffffffb:
              fVar54 = fVar30;
              break;
            case -10:
switchD_001979ce_caseD_fffffffa:
              fVar54 = fVar31;
              break;
            case -9:
switchD_001979ce_caseD_fffffff9:
              fVar54 = fVar32;
              break;
            case -8:
              goto switchD_001979ce_caseD_fffffff8;
            case -7:
switchD_001979ce_caseD_fffffff7:
              fVar54 = fVar33;
              break;
            case -6:
switchD_001979ce_caseD_fffffff6:
              fVar54 = fVar34;
              break;
            case -5:
switchD_001979ce_caseD_fffffff5:
              fVar54 = fVar35;
              break;
            case -4:
switchD_001979ce_caseD_fffffff4:
              fVar54 = fVar36;
            }
          }
          else {
            fVar54 = -1.0;
            if (iVar15 == 7) {
              fVar54 = -1.0;
              switch(iVar16) {
              case -0xc:
                goto switchD_00197a2e_caseD_fffffffc;
              case -0xb:
                goto switchD_00197a2e_caseD_fffffffb;
              case -10:
                goto switchD_00197a2e_caseD_fffffffa;
              case -9:
                goto switchD_00197a2e_caseD_fffffff9;
              case -8:
                goto switchD_001979ce_caseD_fffffff8;
              case -7:
                goto switchD_00197a2e_caseD_fffffff7;
              case -6:
                goto switchD_00197a2e_caseD_fffffff6;
              case -5:
                goto switchD_00197a2e_caseD_fffffff5;
              case -4:
                goto switchD_00197a2e_caseD_fffffff4;
              }
            }
          }
          auVar24._0_4_ = (float)((int)local_a8 + iVar16);
          auVar24._4_12_ = auVar53._4_12_;
          auVar18 = vfmadd132ss_fma(auVar24,ZEXT416((uint)local_64),ZEXT416((uint)local_58._0_4_));
          auVar25._8_4_ = 0x3effffff;
          auVar25._0_8_ = 0x3effffff3effffff;
          auVar25._12_4_ = 0x3effffff;
          auVar23._8_4_ = 0x80000000;
          auVar23._0_8_ = 0x8000000080000000;
          auVar23._12_4_ = 0x80000000;
          auVar19 = vpternlogd_avx512vl(auVar25,auVar18,auVar23,0xf8);
          auVar18 = ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_));
          auVar18 = vroundss_avx(auVar18,auVar18,0xb);
          iVar4 = (int)auVar18._0_4_;
          col = iVar4 - scale;
          local_ac = 0.0;
          local_b0 = 0.0;
          if ((((row < 1) || (col < 1)) || (iimage->height < row + iVar7)) ||
             (iVar6 = col + (int)local_90, iimage->width < iVar6)) {
            haarXY(iimage,row,col,scale,&local_ac,&local_b0);
          }
          else {
            pfVar1 = iimage->data;
            iVar8 = iimage->data_width;
            iVar11 = iVar8 * (row + -1);
            iVar14 = iVar8 * ((int)auVar17._0_4_ + -1);
            iVar8 = iVar8 * (row + -1 + iVar7);
            auVar18 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar11 + -1 + iVar4] -
                                                    pfVar1[iVar8 + -1 + iVar4])),
                                      SUB6416(ZEXT464(0x40000000),0),
                                      ZEXT416((uint)(pfVar1[iVar8 + -1 + iVar6] -
                                                    pfVar1[iVar11 + -1 + col])));
            local_ac = (pfVar1[iVar8 + -1 + col] - pfVar1[iVar11 + -1 + iVar6]) + auVar18._0_4_;
            auVar18 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar14 + -1 + col] -
                                                    pfVar1[iVar14 + -1 + iVar6])),
                                      SUB6416(ZEXT464(0x40000000),0),
                                      ZEXT416((uint)(pfVar1[iVar8 + -1 + iVar6] -
                                                    pfVar1[iVar11 + -1 + col])));
            local_b0 = auVar18._0_4_ - (pfVar1[iVar8 + -1 + col] - pfVar1[iVar11 + -1 + iVar6]);
          }
          fVar54 = fVar45 * fVar54;
          auVar18 = vinsertps_avx(ZEXT416((uint)local_b0),ZEXT416((uint)local_ac),0x10);
          auVar27._0_4_ = fVar54 * auVar18._0_4_;
          auVar27._4_4_ = fVar54 * auVar18._4_4_;
          auVar27._8_4_ = fVar54 * auVar18._8_4_;
          auVar27._12_4_ = fVar54 * auVar18._12_4_;
          auVar26._8_4_ = 0x7fffffff;
          auVar26._0_8_ = 0x7fffffff7fffffff;
          auVar26._12_4_ = 0x7fffffff;
          auVar18 = vandps_avx512vl(auVar27,auVar26);
          auVar18 = vmovlhps_avx(auVar27,auVar18);
          fVar54 = auVar49._0_4_ + auVar18._0_4_;
          fVar50 = auVar49._4_4_ + auVar18._4_4_;
          fVar51 = auVar49._8_4_ + auVar18._8_4_;
          fVar52 = auVar49._12_4_ + auVar18._12_4_;
          auVar49 = ZEXT1664(CONCAT412(fVar52,CONCAT48(fVar51,CONCAT44(fVar50,fVar54))));
          iVar16 = iVar16 + 1;
        } while (iVar16 != -3);
        iVar10 = iVar10 + 1;
        uVar12 = (int)local_80 + 1;
        uVar13 = (ulong)uVar12;
      } while (uVar12 != 5);
      if (local_68 < 0x10) {
        local_48 = ZEXT416((uint)gauss_s2_arr[local_68]);
      }
      uVar9 = (ulong)((int)local_60 + 5);
      uVar12 = local_68 + 1;
      auVar46._0_4_ = fVar54 * (float)local_48._0_4_;
      auVar46._4_4_ = fVar50 * (float)local_48._0_4_;
      auVar46._8_4_ = fVar51 * (float)local_48._0_4_;
      auVar46._12_4_ = fVar52 * (float)local_48._0_4_;
      *(undefined1 (*) [16])(local_88->descriptor + local_98) = auVar46;
      auVar48._0_4_ = auVar46._0_4_ * auVar46._0_4_;
      auVar48._4_4_ = auVar46._4_4_ * auVar46._4_4_;
      auVar48._8_4_ = auVar46._8_4_ * auVar46._8_4_;
      auVar48._12_4_ = auVar46._12_4_ * auVar46._12_4_;
      auVar17 = vmovshdup_avx(auVar48);
      auVar18 = vfmadd231ss_fma(auVar17,auVar46,auVar46);
      auVar17 = vshufpd_avx(auVar46,auVar46,1);
      auVar18 = vfmadd213ss_fma(auVar17,auVar17,auVar18);
      auVar17 = vshufps_avx(auVar46,auVar46,0xff);
      auVar17 = vfmadd213ss_fma(auVar17,auVar17,auVar18);
      fVar45 = local_74 + auVar17._0_4_;
      local_98 = local_98 + 4;
    } while (uVar12 != local_9c);
    uVar12 = local_6c + 4;
    local_9c = local_9c + 4;
    local_a8 = (ulong)((int)local_a8 + 5);
    bVar2 = 2 < iVar15;
    iVar15 = iVar15 + 5;
    if (bVar2) {
      if (fVar45 < 0.0) {
        fVar45 = sqrtf(fVar45);
      }
      else {
        auVar17 = vsqrtss_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45));
        fVar45 = auVar17._0_4_;
      }
      auVar53 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar45)));
      lVar5 = 0;
      do {
        auVar49 = vmulps_avx512f(auVar53,*(undefined1 (*) [64])(local_88->descriptor + lVar5));
        *(undefined1 (*) [64])(local_88->descriptor + lVar5) = auVar49;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      return;
    }
  } while( true );
}

Assistant:

void get_msurf_descriptor_precompute_gauss_case(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_inlinedHaarWavelets
        - precompute gauss_s2 like get_msurf_descriptor_gauss_s2_precomputed 
          (changed to use case statements here)
        - precompute gauss_s1 by computing them once 
          with separable kernels and using case statements
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    float gauss_s1_c0_m4 = expf(g1_factor * (e_c0_m4 * e_c0_m4));
    float gauss_s1_c0_m3 = expf(g1_factor * (e_c0_m3 * e_c0_m3));
    float gauss_s1_c0_m2 = expf(g1_factor * (e_c0_m2 * e_c0_m2));
    float gauss_s1_c0_m1 = expf(g1_factor * (e_c0_m1 * e_c0_m1));
    float gauss_s1_c0_z0 = 1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    float gauss_s1_c0_p1 = expf(g1_factor * (e_c0_p1 * e_c0_p1));
    float gauss_s1_c0_p2 = expf(g1_factor * (e_c0_p2 * e_c0_p2));
    float gauss_s1_c0_p3 = expf(g1_factor * (e_c0_p3 * e_c0_p3));
    float gauss_s1_c0_p4 = expf(g1_factor * (e_c0_p4 * e_c0_p4));

    float gauss_s1_c1_m4 = expf(g1_factor * (e_c1_m4 * e_c1_m4));
    float gauss_s1_c1_m3 = expf(g1_factor * (e_c1_m3 * e_c1_m3));
    float gauss_s1_c1_m2 = expf(g1_factor * (e_c1_m2 * e_c1_m2));
    float gauss_s1_c1_m1 = expf(g1_factor * (e_c1_m1 * e_c1_m1));
    float gauss_s1_c1_z0 = 1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    float gauss_s1_c1_p1 = expf(g1_factor * (e_c1_p1 * e_c1_p1));
    float gauss_s1_c1_p2 = expf(g1_factor * (e_c1_p2 * e_c1_p2));
    float gauss_s1_c1_p3 = expf(g1_factor * (e_c1_p3 * e_c1_p3));
    float gauss_s1_c1_p4 = expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c1_p4; break;
                        case -3: gauss_s1_y = gauss_s1_c1_p3; break;
                        case -2: gauss_s1_y = gauss_s1_c1_p2; break;
                        case -1: gauss_s1_y = gauss_s1_c1_p1; break;
                        case 0:  gauss_s1_y = gauss_s1_c1_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c1_m1; break;
                        case 2:  gauss_s1_y = gauss_s1_c1_m2; break;
                        case 3:  gauss_s1_y = gauss_s1_c1_m3; break;
                        case 4:  gauss_s1_y = gauss_s1_c1_m4; break;
                    };
                } else if (j == -3) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c0_p4; break;
                        case -3: gauss_s1_y = gauss_s1_c0_p3; break;
                        case -2: gauss_s1_y = gauss_s1_c0_p2; break;
                        case -1: gauss_s1_y = gauss_s1_c0_p1; break;
                        case 0:  gauss_s1_y = gauss_s1_c0_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c0_m1; break;
                        case 2:  gauss_s1_y = gauss_s1_c0_m2; break;
                        case 3:  gauss_s1_y = gauss_s1_c0_m3; break;
                        case 4:  gauss_s1_y = gauss_s1_c0_m4; break;
                    };
                } else if (j == 2) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c0_m4; break;
                        case -3: gauss_s1_y = gauss_s1_c0_m3; break;
                        case -2: gauss_s1_y = gauss_s1_c0_m2; break;
                        case -1: gauss_s1_y = gauss_s1_c0_m1; break;
                        case 0:  gauss_s1_y = gauss_s1_c0_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c0_p1; break;
                        case 2:  gauss_s1_y = gauss_s1_c0_p2; break;
                        case 3:  gauss_s1_y = gauss_s1_c0_p3; break;
                        case 4:  gauss_s1_y = gauss_s1_c0_p4; break;
                    };
                } else if (j == 7) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c1_m4; break;
                        case -3: gauss_s1_y = gauss_s1_c1_m3; break;
                        case -2: gauss_s1_y = gauss_s1_c1_m2; break;
                        case -1: gauss_s1_y = gauss_s1_c1_m1; break;
                        case 0:  gauss_s1_y = gauss_s1_c1_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c1_p1; break;
                        case 2:  gauss_s1_y = gauss_s1_c1_p2; break;
                        case 3:  gauss_s1_y = gauss_s1_c1_p3; break;
                        case 4:  gauss_s1_y = gauss_s1_c1_p4; break;
                    };
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    //float xs_sub_sample_x = (float) xs-sample_x;
                    //float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get x coords of sample point
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c1_p4; break;
                            case -3: gauss_s1_x = gauss_s1_c1_p3; break;
                            case -2: gauss_s1_x = gauss_s1_c1_p2; break;
                            case -1: gauss_s1_x = gauss_s1_c1_p1; break;
                            case 0:  gauss_s1_x = gauss_s1_c1_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c1_m1; break;
                            case 2:  gauss_s1_x = gauss_s1_c1_m2; break;
                            case 3:  gauss_s1_x = gauss_s1_c1_m3; break;
                            case 4:  gauss_s1_x = gauss_s1_c1_m4; break;
                        };
                    } else if (i == -3) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c0_p4; break;
                            case -3: gauss_s1_x = gauss_s1_c0_p3; break;
                            case -2: gauss_s1_x = gauss_s1_c0_p2; break;
                            case -1: gauss_s1_x = gauss_s1_c0_p1; break;
                            case 0:  gauss_s1_x = gauss_s1_c0_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c0_m1; break;
                            case 2:  gauss_s1_x = gauss_s1_c0_m2; break;
                            case 3:  gauss_s1_x = gauss_s1_c0_m3; break;
                            case 4:  gauss_s1_x = gauss_s1_c0_m4; break;
                        };
                    } else if (i == 2) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c0_m4; break;
                            case -3: gauss_s1_x = gauss_s1_c0_m3; break;
                            case -2: gauss_s1_x = gauss_s1_c0_m2; break;
                            case -1: gauss_s1_x = gauss_s1_c0_m1; break;
                            case 0:  gauss_s1_x = gauss_s1_c0_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c0_p1; break;
                            case 2:  gauss_s1_x = gauss_s1_c0_p2; break;
                            case 3:  gauss_s1_x = gauss_s1_c0_p3; break;
                            case 4:  gauss_s1_x = gauss_s1_c0_p4; break;
                        };
                    } else if (i == 7) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c1_m4; break;
                            case -3: gauss_s1_x = gauss_s1_c1_m3; break;
                            case -2: gauss_s1_x = gauss_s1_c1_m2; break;
                            case -1: gauss_s1_x = gauss_s1_c1_m1; break;
                            case 0:  gauss_s1_x = gauss_s1_c1_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c1_p1; break;
                            case 2:  gauss_s1_x = gauss_s1_c1_p2; break;
                            case 3:  gauss_s1_x = gauss_s1_c1_p3; break;
                            case 4:  gauss_s1_x = gauss_s1_c1_p4; break;
                        };
                    }

/*
                    //Get the gaussian weighted x and y responses
                    float gauss_s1_x_real = expf(g1_factor * (xs_sub_sample_x_squared));
                    float gauss_s1_y_real = expf(g1_factor * (ys_sub_sample_y_squared));

                    if (gauss_s1_x != gauss_s1_x_real || gauss_s1_y != gauss_s1_y_real) {
                        std::cout << "gauss_s1_x: " << gauss_s1_x << std::endl;
                        std::cout << "gauss_s1_y: " << gauss_s1_y << std::endl;
                        std::cout << "gauss_s1_x_real: " << gauss_s1_x_real << std::endl;
                        std::cout << "gauss_s1_y_real: " << gauss_s1_y_real << std::endl;
                    }
*/

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            //float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 
            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            //float gauss_s2 = gauss_s2_precomputed[gauss_s2_index++];
            float gauss_s2;
            switch (gauss_s2_index) {
                case 0:  gauss_s2 = 0.026022f; break;
                case 1:  gauss_s2 = 0.040585f; break;
                case 2:  gauss_s2 = 0.040585f; break;
                case 3:  gauss_s2 = 0.026022f; break;
                case 4:  gauss_s2 = 0.040585f; break;
                case 5:  gauss_s2 = 0.063297f; break;
                case 6:  gauss_s2 = 0.063297f; break;
                case 7:  gauss_s2 = 0.040585f; break;
                case 8:  gauss_s2 = 0.040585f; break;
                case 9:  gauss_s2 = 0.063297f; break;
                case 10: gauss_s2 = 0.063297f; break;
                case 11: gauss_s2 = 0.040585f; break;
                case 12: gauss_s2 = 0.026022f; break;
                case 13: gauss_s2 = 0.040585f; break;
                case 14: gauss_s2 = 0.040585f; break;
                case 15: gauss_s2 = 0.026022f; break;
            };
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}